

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_ATMOS.cpp
# Opt level: O0

h__Writer * __thiscall
ASDCP::ATMOS::MXFWriter::h__Writer::DCData_DDesc_to_MD(h__Writer *this,DCDataDescriptor *DDesc)

{
  Rational *in_RDX;
  ulong local_30;
  Rational local_28;
  PrivateDCDataDescriptor *DDescObj;
  DCDataDescriptor *DDesc_local;
  h__Writer *this_local;
  
  DDesc_local = DDesc;
  this_local = this;
  if (DDesc[0x12].EditRate == (Rational)0x0) {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_PTR);
  }
  else {
    local_28 = DDesc[0x12].EditRate;
    DDescObj = (PrivateDCDataDescriptor *)in_RDX;
    MXF::Rational::operator=((Rational *)((long)local_28 + 0xe8),in_RDX);
    local_30 = (ulong)*(uint *)&(DDescObj->super_GenericDataEssenceDescriptor).super_FileDescriptor.
                                super_GenericDescriptor.super_InterchangeObject.super_KLVPacket.
                                m_KeyStart;
    MXF::optional_property<unsigned_long_long>::operator=
              ((optional_property<unsigned_long_long> *)((long)local_28 + 0xf8),&local_30);
    Kumu::Identifier<16U>::Set
              ((Identifier<16U> *)((long)local_28 + 0x150),
               (byte_t *)
               ((long)&(DDescObj->super_GenericDataEssenceDescriptor).super_FileDescriptor.
                       super_GenericDescriptor.super_InterchangeObject.super_KLVPacket.m_ValueStart
               + 4));
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::ATMOS::MXFWriter::h__Writer::DCData_DDesc_to_MD(ASDCP::DCData::DCDataDescriptor& DDesc)
{
  ASDCP_TEST_NULL(m_EssenceDescriptor);
  MXF::PrivateDCDataDescriptor* DDescObj = static_cast<MXF::PrivateDCDataDescriptor *>(m_EssenceDescriptor);

  DDescObj->SampleRate = DDesc.EditRate;
  DDescObj->ContainerDuration = DDesc.ContainerDuration;
  DDescObj->DataEssenceCoding.Set(DDesc.DataEssenceCoding);  
  return RESULT_OK;
}